

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringTools.hpp
# Opt level: O0

bool CLI::detail::valid_later_char<char>(char c)

{
  bool bVar1;
  bool local_35;
  locale local_18 [15];
  char local_9;
  char c_local;
  
  local_9 = c;
  ::std::locale::locale(local_18);
  bVar1 = std::isalnum<char>(c,local_18);
  local_35 = true;
  if (((!bVar1) && (local_35 = true, local_9 != '_')) && (local_35 = true, local_9 != '.')) {
    local_35 = local_9 == '-';
  }
  ::std::locale::~locale(local_18);
  return local_35;
}

Assistant:

bool valid_later_char(T c) {
    return std::isalnum(c, std::locale()) || c == '_' || c == '.' || c == '-';
}